

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::SetItem
               (Var receiver,RecyclableObject *object,uint64 index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags)

{
  BOOL BVar1;
  undefined4 in_register_0000008c;
  PropertyValueInfo local_88;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  Var local_38;
  
  propertyRecord = (PropertyRecord *)CONCAT44(in_register_0000008c,propertyOperationFlags);
  local_48 = (PropertyRecord *)0x0;
  local_38 = value;
  GetPropertyIdForInt(index,scriptContext,&local_48);
  local_88.m_instance = (RecyclableObject *)0x0;
  local_88.m_propertyIndex = 0xffff;
  local_88.m_attributes = '\0';
  local_88.flags = InlineCacheNoFlags;
  local_88.cacheInfoFlag = defaultInfoFlags;
  local_88.inlineCache = (InlineCache *)0x0;
  local_88.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  local_88.functionBody = (FunctionBody *)0x0;
  local_88.prop = (RecyclableObject *)0x0;
  local_88.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  local_88.inlineCacheIndex = 0xffffffff;
  local_88.allowResizingPolymorphicInlineCache = true;
  BVar1 = SetProperty_Internal<false>
                    (receiver,object,false,local_48->pid,local_38,&local_88,scriptContext,
                     (PropertyOperationFlags)propertyRecord);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::SetItem(Var receiver, RecyclableObject* object, uint64 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, scriptContext, &propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, propertyOperationFlags);
    }